

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O0

void DrawTextCodepoint(Font font,int codepoint,Vector2 position,float fontSize,Color tint)

{
  Rectangle source;
  Rectangle dest;
  long lVar1;
  int iVar2;
  float fVar3;
  Rectangle srcRec;
  Rectangle dstRec;
  float scaleFactor;
  int index;
  float fontSize_local;
  int codepoint_local;
  Color tint_local;
  Vector2 position_local;
  
  lVar1 = font._8_8_;
  iVar2 = GetGlyphIndex(font,codepoint);
  fVar3 = fontSize / (float)font.baseSize;
  codepoint_local = (int)position.x;
  tint_local = (Color)position.y;
  source.y = font.recs[iVar2].y - (float)lVar1;
  source.x = font.recs[iVar2].x - (float)lVar1;
  source.width = (float)lVar1 + (float)lVar1 + font.recs[iVar2].width;
  source.height = (float)lVar1 + (float)lVar1 + font.recs[iVar2].height;
  dest.y = ((float)font.chars[iVar2].offsetY * fVar3 + (float)tint_local) - (float)lVar1 * fVar3;
  dest.x = ((float)font.chars[iVar2].offsetX * fVar3 + (float)codepoint_local) -
           (float)lVar1 * fVar3;
  dest.width = ((float)lVar1 + (float)lVar1 + font.recs[iVar2].width) * fVar3;
  dest.height = ((float)lVar1 + (float)lVar1 + font.recs[iVar2].height) * fVar3;
  DrawTexturePro(font.texture,source,dest,(Vector2)0x0,0.0,tint);
  return;
}

Assistant:

void DrawTextCodepoint(Font font, int codepoint, Vector2 position, float fontSize, Color tint)
{
    // Character index position in sprite font
    // NOTE: In case a codepoint is not available in the font, index returned points to '?'
    int index = GetGlyphIndex(font, codepoint);
    float scaleFactor = fontSize/font.baseSize;     // Character quad scaling factor

    // Character destination rectangle on screen
    // NOTE: We consider charsPadding on drawing
    Rectangle dstRec = { position.x + font.chars[index].offsetX*scaleFactor - (float)font.charsPadding*scaleFactor,
                      position.y + font.chars[index].offsetY*scaleFactor - (float)font.charsPadding*scaleFactor,
                      (font.recs[index].width + 2.0f*font.charsPadding)*scaleFactor,
                      (font.recs[index].height + 2.0f*font.charsPadding)*scaleFactor };

    // Character source rectangle from font texture atlas
    // NOTE: We consider chars padding when drawing, it could be required for outline/glow shader effects
    Rectangle srcRec = { font.recs[index].x - (float)font.charsPadding, font.recs[index].y - (float)font.charsPadding,
                         font.recs[index].width + 2.0f*font.charsPadding, font.recs[index].height + 2.0f*font.charsPadding };

    // Draw the character texture on the screen
    DrawTexturePro(font.texture, srcRec, dstRec, (Vector2){ 0, 0 }, 0.0f, tint);
}